

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O3

bool __thiscall libchars::history::search(history *this,size_t idx)

{
  bool bVar1;
  
  if (*(history **)(this + 0x30) != this + 0x30) {
    *(history **)(this + 0x48) = this + 0x30;
    this[0x50] = (history)0x1;
    if (*(ulong *)(this + 0x18) < idx) {
      idx = *(ulong *)(this + 0x18);
    }
    *(size_t *)(this + 0x58) = idx;
    this[8] = (history)0x1;
    bVar1 = search_prev(this);
    if ((bVar1) && (this[0x50] != (history)0x1)) {
      return true;
    }
  }
  this[8] = (history)0x0;
  return false;
}

Assistant:

bool history::search(size_t idx)
    {
        if (lines.empty()) {
            busy = false;
            return false;
        }
        else {
            li = lines.end();
            overflow = true;
            s_idx = (idx > line_tmp.length()) ? line_tmp.length() : idx;
            busy = true;
            if (!search_prev() || overflow) {
                busy = false;
                return false;
            }
            return true;
        }
    }